

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  mpt_stream srm;
  undefined1 local_b0 [8];
  void *local_a8;
  size_t local_a0;
  undefined8 local_68;
  
  memset(local_b0,0,0x98);
  local_68 = 0xffffffffffffffff;
  if (argc < 2) {
    main_cold_2();
  }
  else {
    iVar1 = mpt_stream_pipe(local_b0,argv[1],argv + 1);
    if (-1 < iVar1) {
      mpt_stream_setmode(local_b0,0x30);
      iVar1 = mpt_stream_poll(local_b0,0x11,0xffffffff);
      if (0 < iVar1) {
        main_cold_1();
      }
      fwrite(local_a8,local_a0,1,_stdout);
      mpt_stream_close(local_b0);
      return 0;
    }
    perror("call");
  }
  return 1;
}

Assistant:

int main(int argc, char * const argv[])
{
	struct mpt_stream srm = MPT_STREAM_INIT;
	int mode;
	
	if (argc < 2) {
		fprintf(stderr, "%s %s [%s]\n", *argv, "<executable>", "<args>");
		return 1;
	}
	if ((mode = mpt_stream_pipe(&srm._info, argv[1], argv+1)) < 0) {
		perror("call");
		return 1;
	}
	mpt_stream_setmode(&srm, MPT_ENUM(StreamBuffer));
	
	while (mpt_stream_poll(&srm, POLLIN | POLLHUP, -1) > 0) {
		fprintf(stderr, "%d (%d)\n", (int) srm._rd.data.len, (int) srm._rd.data.max);
	}
	fwrite(srm._rd.data.base, srm._rd.data.len, 1, stdout);
	mpt_stream_close(&srm);
	return 0;
}